

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::ReferenceMemory::invalidate
          (ReferenceMemory *this,size_t offset,size_t size)

{
  bool bVar1;
  ulong local_28;
  size_t ndx;
  size_t size_local;
  size_t offset_local;
  ReferenceMemory *this_local;
  
  if (this->m_atomSize == 1) {
    BitVector::vectorAnd(&this->m_defined,&this->m_flushed,offset,size);
  }
  else {
    for (local_28 = 0; local_28 < size / this->m_atomSize; local_28 = local_28 + 1) {
      bVar1 = BitVector::get(&this->m_flushed,offset / this->m_atomSize + local_28);
      if (!bVar1) {
        BitVector::setRange(&this->m_defined,offset + local_28 * this->m_atomSize,this->m_atomSize,
                            false);
      }
    }
  }
  return;
}

Assistant:

void invalidate (size_t offset, size_t size)
	{
		DE_ASSERT((offset % m_atomSize) == 0);
		DE_ASSERT((size % m_atomSize) == 0);

		if (m_atomSize == 1)
		{
			m_defined.vectorAnd(m_flushed, offset, size);
		}
		else
		{
			for (size_t ndx = 0; ndx < size / m_atomSize; ndx++)
			{
				if (!m_flushed.get((offset / m_atomSize) + ndx))
					m_defined.setRange(offset + ndx * m_atomSize, m_atomSize, false);
			}
		}
	}